

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferBlitCase::render
          (FramebufferBlitCase *this,GLuint program,IVec4 *viewport)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  ObjectWrapper *this_00;
  deInt32 defaultFramebuffer;
  int height;
  int width;
  Functions *gl;
  IVec4 *viewport_local;
  GLuint program_local;
  FramebufferBlitCase *this_local;
  long lVar10;
  
  iVar2 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar2);
  iVar2 = tcu::Vector<int,_4>::z(viewport);
  iVar3 = tcu::Vector<int,_4>::w(viewport);
  iVar4 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[6])();
  pcVar1 = *(code **)(lVar10 + 0x78);
  this_00 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             ::operator*(&(this->m_fbo).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        )->super_ObjectWrapper;
  dVar5 = glu::ObjectWrapper::operator*(this_00);
  (*pcVar1)(0x8ca8,dVar5);
  (**(code **)(lVar10 + 0x78))(0x8ca9,iVar4);
  pcVar1 = *(code **)(lVar10 + 0x140);
  iVar6 = tcu::Vector<int,_4>::x(viewport);
  iVar7 = tcu::Vector<int,_4>::y(viewport);
  iVar8 = tcu::Vector<int,_4>::x(viewport);
  iVar9 = tcu::Vector<int,_4>::y(viewport);
  (*pcVar1)(0,0,0x40,0x40,iVar6,iVar7,iVar8 + iVar2,iVar9 + iVar3,0x4000,0x2600);
  (**(code **)(lVar10 + 0x78))(0x8ca8,iVar4);
  return;
}

Assistant:

void FramebufferBlitCase::render(GLuint program, const IVec4& viewport) const
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const int				width				= viewport.z();
	const int				height				= viewport.w();
	const deInt32			defaultFramebuffer	= m_renderCtx.getDefaultFramebuffer();

	DE_UNREF(program);

	// blit to default framebuffer
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, defaultFramebuffer);

	gl.blitFramebuffer(0, 0, SIZE, SIZE, viewport.x(), viewport.y(), viewport.x() + width, viewport.y() + height, GL_COLOR_BUFFER_BIT, GL_NEAREST);

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, defaultFramebuffer);
}